

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

void flow_change_notify(pcp_flow_t *flow,pcp_fstate_e state)

{
  pcp_ctx_s *ppVar1;
  pcp_ctx_t *ctx;
  sockaddr_storage ext_addr;
  sockaddr_storage src_addr;
  pcp_fstate_e state_local;
  pcp_flow_t *flow_local;
  
  ppVar1 = flow->ctx;
  if (ppVar1->flow_change_cb_fun != (pcp_flow_change_notify)0x0) {
    pcp_fill_sockaddr((sockaddr *)&ext_addr.__ss_align,&(flow->kd).src_ip,
                      (flow->kd).field_5.map_peer.src_port,0,(flow->kd).scope_id);
    if (state == pcp_state_succeeded) {
      pcp_fill_sockaddr((sockaddr *)&ctx,&(flow->field_5).map_peer.ext_ip,
                        (flow->field_5).map_peer.ext_port,0,0);
    }
    else {
      memset(&ctx,0,0x80);
      ctx._0_2_ = 2;
    }
    (*ppVar1->flow_change_cb_fun)
              (flow,(sockaddr *)&ext_addr.__ss_align,(sockaddr *)&ctx,state,
               ppVar1->flow_change_cb_arg);
  }
  return;
}

Assistant:

static void flow_change_notify(pcp_flow_t *flow, pcp_fstate_e state) {
    struct sockaddr_storage src_addr, ext_addr;
    pcp_ctx_t *ctx = flow->ctx;

    PCP_LOG_DEBUG("Flow's %d state changed to: %s", flow->key_bucket,
                  dbg_get_fstate_name(state));

    if (ctx->flow_change_cb_fun) {
        pcp_fill_sockaddr((struct sockaddr *)&src_addr, &flow->kd.src_ip,
                          flow->kd.map_peer.src_port, 0, flow->kd.scope_id);
        if (state == pcp_state_succeeded) {
            pcp_fill_sockaddr((struct sockaddr *)&ext_addr,
                              &flow->map_peer.ext_ip, flow->map_peer.ext_port,
                              0, 0 /* scope_id */);
        } else {
            memset(&ext_addr, 0, sizeof(ext_addr));
            ext_addr.ss_family = AF_INET;
        }
        ctx->flow_change_cb_fun(flow, (struct sockaddr *)&src_addr,
                                (struct sockaddr *)&ext_addr, state,
                                ctx->flow_change_cb_arg);
    }
}